

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_grammar.cpp
# Opt level: O0

ostream * Omega_h::operator<<(ostream *os,Grammar *g)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  reference piVar6;
  int *symb;
  const_iterator __end2;
  const_iterator __begin2;
  RHS *__range2;
  value_type *prod;
  int i_1;
  int i;
  Grammar *g_local;
  ostream *os_local;
  
  std::operator<<(os,"symbols:\n");
  prod._4_4_ = 0;
  while( true ) {
    iVar2 = size<std::__cxx11::string>(&g->symbol_names);
    if (iVar2 <= prod._4_4_) break;
    poVar3 = (ostream *)std::ostream::operator<<(os,prod._4_4_);
    poVar3 = std::operator<<(poVar3,": ");
    pvVar4 = at<std::__cxx11::string>(&g->symbol_names,prod._4_4_);
    poVar3 = std::operator<<(poVar3,(string *)pvVar4);
    std::operator<<(poVar3,"\n");
    prod._4_4_ = prod._4_4_ + 1;
  }
  std::operator<<(os,"productions:\n");
  prod._0_4_ = 0;
  while( true ) {
    iVar2 = size<Omega_h::Grammar::Production>(&g->productions);
    if (iVar2 <= (int)prod) break;
    pvVar5 = at<Omega_h::Grammar::Production>(&g->productions,(int)prod);
    poVar3 = (ostream *)std::ostream::operator<<(os,(int)prod);
    poVar3 = std::operator<<(poVar3,": ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pvVar5->lhs);
    std::operator<<(poVar3," ::=");
    __end2 = std::vector<int,_std::allocator<int>_>::begin(&pvVar5->rhs);
    symb = (int *)std::vector<int,_std::allocator<int>_>::end(&pvVar5->rhs);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                  *)&symb);
      if (!bVar1) break;
      piVar6 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end2);
      poVar3 = std::operator<<(os,' ');
      std::ostream::operator<<(poVar3,*piVar6);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2);
    }
    std::operator<<(os,'\n');
    prod._0_4_ = (int)prod + 1;
  }
  std::operator<<(os,'\n');
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, Grammar const& g) {
  os << "symbols:\n";
  for (int i = 0; i < size(g.symbol_names); ++i) {
    os << i << ": " << at(g.symbol_names, i) << "\n";
  }
  os << "productions:\n";
  for (int i = 0; i < size(g.productions); ++i) {
    auto& prod = at(g.productions, i);
    os << i << ": " << prod.lhs << " ::=";
    for (auto& symb : prod.rhs) {
      os << ' ' << symb;
    }
    os << '\n';
  }
  os << '\n';
  return os;
}